

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

int xcb_input_hierarchy_change_data_serialize
              (void **_buffer,uint16_t type,xcb_input_hierarchy_change_data_t *_aux)

{
  ushort uVar1;
  uint uVar2;
  void *__dest;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined6 in_register_00000032;
  int iVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  uint xcb_pad;
  char xcb_pad0 [3];
  iovec xcb_parts [16];
  uint local_140;
  undefined2 local_13c;
  undefined1 local_13a;
  xcb_input_hierarchy_change_data_t *local_138;
  ulong local_130;
  uint8_t *local_128 [5];
  ulong local_100;
  undefined2 *local_f8;
  ulong local_f0 [23];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  local_140 = 0;
  local_13a = 0;
  local_13c = 0;
  memset(&local_138,0xaa,0x100);
  uVar2 = 0;
  iVar5 = 0;
  iVar3 = 0;
  iVar6 = 0;
  if ((int)CONCAT62(in_register_00000032,type) == 1) {
    local_138 = _aux;
    local_130 = 2;
    local_128[0] = &(_aux->add_master).send_core;
    local_128[1] = (uint8_t *)0x1;
    local_128[2] = &(_aux->add_master).enable;
    local_128[3] = (uint8_t *)0x1;
    local_128[4] = (uint8_t *)(_aux->add_master).name;
    uVar1 = (_aux->add_master).name_len;
    local_100 = (ulong)uVar1;
    iVar3 = 4;
    uVar4 = -(uint)uVar1 & 3;
    iVar5 = uVar1 + 4 + uVar4;
    if (uVar4 == 0) {
      iVar6 = 4;
    }
    else {
      local_f8 = &local_13c;
      local_f0[0] = (ulong)uVar4;
      iVar6 = 5;
    }
  }
  if (type == 2) {
    uVar7 = (ulong)(uint)(iVar6 << 4);
    *(anon_struct_8_5_ecf828a8_for_remove_master **)((long)&local_138 + uVar7) =
         &_aux->remove_master;
    *(undefined8 *)((long)&local_130 + uVar7) = 2;
    *(uint8_t **)((long)local_128 + uVar7) = &(_aux->remove_master).return_mode;
    *(undefined8 *)((long)local_128 + uVar7 + 8) = 1;
    *(uint **)((long)&local_138 + (uVar7 | 0x20)) = &local_140;
    *(undefined8 *)((long)local_128 + uVar7 + 0x18) = 1;
    *(xcb_input_device_id_t **)((long)local_128 + uVar7 + 0x20) =
         &(_aux->remove_master).return_pointer;
    *(undefined8 *)((long)&local_100 + uVar7) = 2;
    *(xcb_input_device_id_t **)((long)local_f0 + (uVar7 - 8)) =
         &(_aux->remove_master).return_keyboard;
    *(undefined8 *)((long)local_f0 + uVar7) = 2;
    iVar6 = iVar6 + 5;
    uVar2 = 8;
    iVar3 = 2;
  }
  if (type == 3) {
    uVar7 = (ulong)(uint)(iVar6 << 4);
    *(anon_struct_4_2_478ccfb0_for_attach_slave **)((long)&local_138 + uVar7) = &_aux->attach_slave;
    *(undefined8 *)((long)&local_130 + uVar7) = 2;
    *(xcb_input_device_id_t **)((long)local_128 + uVar7) = &(_aux->attach_slave).master;
    uVar2 = uVar2 | 4;
    *(undefined8 *)((long)local_128 + uVar7 + 8) = 2;
    iVar6 = iVar6 + 2;
    iVar3 = 2;
  }
  if (type == 4) {
    uVar7 = (ulong)(uint)(iVar6 << 4);
    *(anon_struct_4_2_a4131a8d_for_detach_slave **)((long)&local_138 + uVar7) = &_aux->detach_slave;
    *(undefined8 *)((long)&local_130 + uVar7) = 2;
    *(undefined2 **)((long)local_128 + uVar7) = &local_13c;
    uVar2 = uVar2 + 4;
    *(undefined8 *)((long)local_128 + uVar7 + 8) = 2;
    iVar6 = iVar6 + 2;
    iVar3 = 1;
  }
  uVar4 = iVar3 - 1U & -uVar2;
  local_140 = uVar4;
  if (uVar4 != 0) {
    *(undefined2 **)((long)&local_138 + (ulong)(uint)(iVar6 << 4)) = &local_13c;
    *(ulong *)((long)&local_130 + (ulong)(uint)(iVar6 << 4)) = (ulong)uVar4;
    iVar6 = iVar6 + 1;
    local_140 = 0;
  }
  uVar4 = iVar5 + uVar2 + uVar4;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar4);
    *_buffer = __dest;
  }
  if (iVar6 != 0) {
    uVar7 = 0;
    do {
      if ((*(void **)((long)&local_138 + uVar7) != (void *)0x0) &&
         (*(size_t *)((long)&local_130 + uVar7) != 0)) {
        memcpy(__dest,*(void **)((long)&local_138 + uVar7),*(size_t *)((long)&local_130 + uVar7));
      }
      __dest = (void *)((long)__dest + *(long *)((long)&local_130 + uVar7));
      uVar7 = uVar7 + 0x10;
    } while ((uint)(iVar6 << 4) != uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

int
xcb_input_hierarchy_change_data_serialize (void                                    **_buffer,
                                           uint16_t                                  type,
                                           const xcb_input_hierarchy_change_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[16];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_ADD_MASTER) {
        /* xcb_input_hierarchy_change_data_t.add_master.name_len */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.name_len;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_hierarchy_change_data_t.add_master.send_core */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.send_core;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.add_master.enable */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.enable;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* name */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->add_master.name;
        xcb_block_len += _aux->add_master.name_len * sizeof(char);
        xcb_parts[xcb_parts_idx].iov_len = _aux->add_master.name_len * sizeof(char);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(char);
        xcb_align_to = 4;
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_REMOVE_MASTER) {
        /* xcb_input_hierarchy_change_data_t.remove_master.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_pointer */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_pointer;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_keyboard */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_keyboard;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_ATTACH_SLAVE) {
        /* xcb_input_hierarchy_change_data_t.attach_slave.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->attach_slave.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.attach_slave.master */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->attach_slave.master;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_DETACH_SLAVE) {
        /* xcb_input_hierarchy_change_data_t.detach_slave.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->detach_slave.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.detach_slave.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}